

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::tryUnitPartitioning(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  double dVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  char cVar6;
  unit_data uVar7;
  uint uVar8;
  undefined8 uVar9;
  pointer pbVar10;
  uint uVar11;
  size_t start;
  ulong uVar12;
  ulong uVar13;
  ulong match_flags_00;
  char cVar14;
  byte bVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  uint64_t uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar20 [16];
  pair<double,_unsigned_long> pVar21;
  precise_unit pVar22;
  size_t part;
  precise_unit res;
  precise_unit bunit;
  string ustring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid;
  size_t local_240;
  undefined1 local_238 [8];
  undefined8 local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined8 local_218;
  precise_unit local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  undefined1 local_1f8 [16];
  value_type local_1e0;
  uint64_t local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  string local_198;
  string local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  ulong uStack_150;
  undefined1 local_148 [16];
  string local_138;
  ulong local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar1,pcVar1 + unit_string->_M_string_length);
  pVar21 = getPrefixMultiplierWord(unit_string);
  dVar3 = pVar21.first;
  local_1f8._8_4_ = extraout_XMM0_Dc;
  local_1f8._0_8_ = dVar3;
  local_1f8._12_4_ = extraout_XMM0_Dd;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    std::__cxx11::string::substr((ulong)local_238,(ulong)unit_string);
    std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_238);
    if (local_238 != (undefined1  [8])&local_228) {
      operator_delete((void *)local_238,local_228._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_1e0._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
    pVar22 = unit_from_string_internal(&local_b0,match_flags);
    uVar9 = pVar22._8_8_;
    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              pVar22.multiplier_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  pVar22.multiplier_;
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      pbVar16 = local_200;
    }
    if (pVar22.base_units_ == (unit_data)0xfa94a488 && NAN((double)pbVar16)) {
      uVar9 = 0xfa94a488;
      dVar3 = NAN;
      uVar18 = 0;
      uVar19 = 0;
    }
    else {
      uVar18 = local_1f8._8_4_;
      uVar19 = local_1f8._12_4_;
      dVar3 = local_1f8._0_8_ * (double)pbVar16;
    }
    local_1f8._8_4_ = uVar18;
    local_1f8._0_8_ = dVar3;
    local_1f8._12_4_ = uVar19;
    goto LAB_0016c7bb;
  }
  local_240 = (ulong)(*(unit_string->_M_dataplus)._M_p != 'N') * 2 + 1;
  std::__cxx11::string::substr((ulong)local_238,(ulong)unit_string);
  std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_238);
  if (local_238 != (undefined1  [8])&local_228) {
    operator_delete((void *)local_238,local_228._M_allocated_capacity + 1);
  }
  bVar15 = local_1e0._M_dataplus._M_p[local_1e0._M_string_length - 1];
  if (((bVar15 == 0x28) || (bVar15 == 0x7b)) || (bVar15 == 0x5b)) {
    local_240 = 1;
    std::__cxx11::string::pop_back();
  }
  uVar11 = (uint)(match_flags >> 0x25) & 7;
  uVar13 = (ulong)uVar11;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0 = match_flags;
  if (uVar13 <= unit_string->_M_string_length - local_240 &&
      local_240 < unit_string->_M_string_length - 1) {
    local_118 = match_flags | 0x400000000;
    local_1f8 = ZEXT816(0x7ff4000000000000);
    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_218 = 0xfa94a488;
    do {
      local_200 = pbVar16;
      if (uVar13 <= local_1e0._M_string_length) {
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_1e0._M_dataplus._M_p,
                   local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
        pVar22 = unit_quick_match(&local_178,local_1c0);
        local_230 = pVar22._8_8_;
        local_238 = (undefined1  [8])pVar22.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if (((NAN((double)local_238)) && (local_230._0_4_ == (unit_data)0xfa94a488)) &&
           ((2 < local_1e0._M_string_length && ((byte)(*local_1e0._M_dataplus._M_p + 0xbfU) < 0x1a))
           )) {
          *local_1e0._M_dataplus._M_p = *local_1e0._M_dataplus._M_p | 0x20;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,local_1e0._M_dataplus._M_p,
                     local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
          pVar22 = unit_quick_match(&local_198,local_1c0);
          local_230 = pVar22._8_8_;
          local_238 = (undefined1  [8])pVar22.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        if ((!NAN((double)local_238) && !NAN((double)local_238)) ||
           (local_230._0_4_ != (unit_data)0xfa94a488)) {
          std::__cxx11::string::substr((ulong)&local_110,(ulong)unit_string);
          pVar22 = unit_from_string_internal(&local_110,local_118);
          local_210._8_8_ = pVar22._8_8_;
          local_210.multiplier_ = pVar22.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          local_148._8_8_ = 0;
          local_148._0_8_ = local_210.multiplier_;
          if ((!NAN(local_210.multiplier_) && !NAN(local_210.multiplier_)) ||
             (local_210.base_units_ != (unit_data)0xfa94a488)) {
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238;
            if ((NAN((double)local_1f8._0_8_) || NAN((double)local_1f8._0_8_)) &&
               ((int)local_218 == -0x56b5b78)) {
              uVar7 = detail::unit_data::operator*((unit_data *)&local_230,&local_210.base_units_);
              local_1f8._8_4_ = local_148._8_4_;
              local_1f8._0_8_ = local_148._0_8_ * (double)local_158;
              local_1f8._12_4_ = local_148._12_4_;
              local_218 = CONCAT44(local_210.commodity_ | local_230._4_4_,uVar7);
            }
            else {
              uVar7 = detail::unit_data::operator*((unit_data *)&local_230,&local_210.base_units_);
              uVar8 = local_210.commodity_ | local_230._4_4_;
              uVar18 = local_148._12_4_;
              dVar3 = local_148._0_8_ * (double)local_158;
              local_148._8_4_ = local_148._8_4_;
              local_148._0_8_ = dVar3;
              local_148._12_4_ = uVar18;
              dVar3 = log10(dVar3);
              local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((ulong)dVar3 & 0x7fffffffffffffff);
              uStack_150 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) & 0x7fffffffffffffff;
              dVar3 = log10((double)local_1f8._0_8_);
              uVar12 = -(ulong)((double)local_158 < ABS(dVar3));
              auVar20._0_8_ = ~uVar12 & local_1f8._0_8_;
              auVar20._8_8_ = ~uStack_150 & local_1f8._8_8_;
              auVar2._8_4_ = (int)(local_148._8_8_ & uStack_150);
              auVar2._0_8_ = local_148._0_8_ & uVar12;
              auVar2._12_4_ = (int)((local_148._8_8_ & uStack_150) >> 0x20);
              local_1f8 = auVar20 | auVar2;
              if ((double)local_158 < ABS(dVar3)) {
                local_218 = CONCAT44(uVar8,uVar7);
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1b8,&local_1e0);
        }
      }
      cVar14 = (char)&local_1e0;
      std::__cxx11::string::push_back(cVar14);
      sVar5 = local_1e0._M_string_length;
      _Var4._M_p = local_1e0._M_dataplus._M_p;
      uVar12 = local_240 + 1;
      bVar15 = local_1e0._M_dataplus._M_p[local_1e0._M_string_length - 1];
      local_240 = uVar12;
      if (((bVar15 == 0x28) || (bVar15 == 0x5b)) || (pbVar16 = local_200, bVar15 == 0x7b)) {
        cVar6 = getMatchCharacter(bVar15);
        segmentcheck(unit_string,cVar6,&local_240);
        if ((_Var4._M_p[sVar5 - 1] == 0x28) &&
           (uVar12 = std::__cxx11::string::find_first_of((char *)unit_string,0x17e940,uVar12),
           pbVar16 = local_200, uVar12 < local_240)) goto LAB_0016c2ed;
        std::__cxx11::string::substr((ulong)local_238,(ulong)unit_string);
        std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_238);
        pbVar16 = local_200;
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238,local_228._M_allocated_capacity + 1);
          pbVar16 = local_200;
        }
      }
      for (; ((bVar15 = local_1e0._M_dataplus._M_p[local_1e0._M_string_length - 1], bVar15 == 0x5f
              || (bVar15 == 0x2d)) && (local_240 < unit_string->_M_string_length - 1));
          local_240 = local_240 + 1) {
        std::__cxx11::string::push_back(cVar14);
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT71((int7)((ulong)pbVar16 >> 8),1);
      }
      if ((byte)(bVar15 - 0x30) < 10) {
        for (; (local_240 < unit_string->_M_string_length - 1 &&
               (cVar6 = (unit_string->_M_dataplus)._M_p[local_240],
               cVar6 == '.' || (byte)(cVar6 - 0x30U) < 10)); local_240 = local_240 + 1) {
          std::__cxx11::string::push_back(cVar14);
        }
      }
      if ((unit_string->_M_string_length - 1 <= local_240) ||
         (unit_string->_M_string_length - local_240 < uVar13)) goto LAB_0016c2ed;
    } while( true );
  }
  local_1f8._0_4_ = 0;
  local_1f8._4_4_ = 0x7ff40000;
  local_1f8._8_4_ = 0;
  local_1f8._12_4_ = 0;
  bVar15 = 0;
  local_218 = 0xfa94a488;
LAB_0016c2fb:
  uVar17 = local_1c0;
  if ((NAN((double)CONCAT44(local_1f8._4_4_,local_1f8._0_4_)) ||
       NAN((double)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))) && ((int)local_218 == -0x56b5b78)) {
    if ((uVar11 < 2) && ((unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] == 'm'))
    {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_1e0._M_dataplus._M_p,
                 local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
      pVar22 = unit_quick_match(&local_d0,uVar17);
      local_230 = pVar22._8_8_;
      local_238 = (undefined1  [8])pVar22.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_1f8._8_8_ = 0;
      local_1f8._0_8_ = local_238;
      if ((!NAN((double)local_238)) || (local_230._0_4_ != (unit_data)0xfa94a488)) {
        uVar7 = detail::unit_data::operator*((unit_data *)&local_230,(unit_data *)((long)&m + 4));
        local_218 = CONCAT44(local_230._4_4_,uVar7);
        goto LAB_0016c7a4;
      }
    }
    if (uVar11 < 3 && (bVar15 & 1) == 0) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)unit_string);
      pVar22 = unit_quick_match(&local_50,uVar17);
      local_210._8_8_ = pVar22._8_8_;
      local_210.multiplier_ = pVar22.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pbVar10 = local_1b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((NAN(local_210.multiplier_) || NAN(local_210.multiplier_)) &&
         (local_210.base_units_ == (unit_data)0xfa94a488)) {
        if (unit_string->_M_string_length == 4) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)unit_string);
          pVar22 = unit_quick_match(&local_70,uVar17);
          local_210._8_8_ = pVar22._8_8_;
          local_210.multiplier_ = pVar22.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::substr((ulong)&local_90,(ulong)unit_string);
          pVar22 = unit_from_string_internal(&local_90,uVar17);
          local_230 = pVar22._8_8_;
          local_238 = (undefined1  [8])pVar22.multiplier_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((!NAN((double)local_238) && !NAN((double)local_238)) ||
             (local_230._0_4_ != (unit_data)0xfa94a488)) {
            pVar22 = precise_unit::operator*(&local_210,(precise_unit *)local_238);
            local_218 = pVar22._8_8_;
            local_1f8._8_4_ = extraout_XMM0_Dc_01;
            local_1f8._0_8_ = pVar22.multiplier_;
            local_1f8._12_4_ = extraout_XMM0_Dd_01;
            goto LAB_0016c7a4;
          }
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_238,(ulong)unit_string);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(&local_1b8,(const_iterator)pbVar10,(value_type *)local_238);
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238,local_228._M_allocated_capacity + 1);
        }
      }
    }
    pbVar10 = local_1b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar11 < 2) &&
       ((cVar14 = *(unit_string->_M_dataplus)._M_p, cVar14 == 'V' || (cVar14 == 'A')))) {
      std::__cxx11::string::substr((ulong)local_238,(ulong)unit_string);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&local_1b8,(const_iterator)pbVar10,(value_type *)local_238);
      if (local_238 != (undefined1  [8])&local_228) {
        operator_delete((void *)local_238,local_228._M_allocated_capacity + 1);
      }
    }
    pbVar16 = local_1b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    pbVar10 = local_1b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start < pbVar16 &&
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::swap((string *)pbVar10);
        pbVar10 = pbVar10 + 1;
        pbVar16 = pbVar16 + -1;
      } while (pbVar10 < pbVar16);
    }
    local_1f8 = ZEXT816(0x7ff4000000000000);
    local_200 = local_1b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar13 = local_1c0 | 0x6000000000;
      pbVar10 = local_1b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = local_1c0;
      do {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        pcVar1 = (pbVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,pcVar1,pcVar1 + pbVar10->_M_string_length);
        pVar22 = unit_quick_match(&local_138,uVar17);
        local_230 = pVar22._8_8_;
        local_238 = (undefined1  [8])pVar22.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        uVar12 = pbVar10->_M_string_length;
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)unit_string);
        uVar17 = local_1c0;
        match_flags_00 = uVar13;
        if (3 < uVar12) {
          match_flags_00 = local_1c0;
        }
        pVar22 = unit_from_string_internal(&local_f0,match_flags_00);
        local_210._8_8_ = pVar22._8_8_;
        local_210.multiplier_ = pVar22.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((!NAN(local_210.multiplier_) && !NAN(local_210.multiplier_)) ||
           (local_210.base_units_ != (unit_data)0xfa94a488)) {
          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_210.multiplier_;
          local_1f8._0_8_ = local_238;
          uVar7 = detail::unit_data::operator*((unit_data *)&local_230,&local_210.base_units_);
          local_218 = CONCAT44(local_210.commodity_ | local_230._4_4_,uVar7);
          local_1f8._8_8_ = 0;
          local_1f8._0_8_ = (double)local_200 * (double)local_1f8._0_8_;
          goto LAB_0016c7a4;
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != local_200);
    }
    local_218 = 0xfa94a488;
  }
LAB_0016c7a4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  uVar9 = local_218;
LAB_0016c7bb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pVar22.base_units_ = (unit_data)(int)uVar9;
  pVar22.commodity_ = (int)((ulong)uVar9 >> 0x20);
  pVar22.multiplier_ = (double)local_1f8._0_8_;
  return pVar22;
LAB_0016c2ed:
  bVar15 = (byte)pbVar16;
  goto LAB_0016c2fb;
}

Assistant:

static precise_unit tryUnitPartitioning(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    std::string ustring = unit_string;

    auto mret = getPrefixMultiplierWord(unit_string);
    if (mret.first != 0.0) {
        ustring = unit_string.substr(mret.second);

        auto retunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(retunit)) {
            return {mret.first, retunit};
        }
        return precise::invalid;
    }

    // a newton(N) in front is somewhat common
    // try a round with just a quick partition
    size_t part = (unit_string.front() == 'N') ? 1 : 3;
    ustring = unit_string.substr(0, part);
    if (ustring.back() == '(' || ustring.back() == '[' ||
        ustring.back() == '{') {
        part = 1;
        ustring.pop_back();
    }
    auto minPartitionSize = getMinPartitionSize(match_flags);
    std::vector<std::string> valid;
    precise_unit possible = precise::invalid;
    bool hasSep{false};
    while (part < unit_string.size() - 1) {
        if (unit_string.size() - part < minPartitionSize) {
            break;
        }
        if (ustring.size() >= minPartitionSize) {
            auto res = unit_quick_match(ustring, match_flags);
            if (!is_valid(res) && ustring.size() >= 3) {
                if (ustring.front() >= 'A' &&
                    ustring.front() <= 'Z') {  // check the lower case version
                                               // since we skipped partitioning
                                               // when we did this earlier
                    ustring[0] += 32;
                    res = unit_quick_match(ustring, match_flags);
                }
            }
            if (is_valid(res)) {
                auto bunit = unit_from_string_internal(
                    unit_string.substr(part),
                    match_flags | skip_partition_check);
                if (is_valid(bunit)) {
                    if (!is_valid(possible)) {
                        possible = res * bunit;
                    } else {
                        auto temp = res * bunit;
                        if (std::abs(log10(temp.multiplier())) <
                            std::abs(log10(possible.multiplier()))) {
                            possible = temp;
                        }
                    }
                }
                valid.push_back(ustring);
            }
        }
        ustring.push_back(unit_string[part]);
        ++part;
        if (ustring.back() == '(' || ustring.back() == '[' ||
            ustring.back() == '{') {
            auto start = part;
            segmentcheck(unit_string, getMatchCharacter(ustring.back()), part);
            if (ustring.back() == '(') {
                if (unit_string.find_first_of("({[*/", start) < part) {
                    // this implies that the contents of the parenthesis
                    // must be a standalone segment and should not be
                    // included in a check
                    break;
                }
            }
            ustring = unit_string.substr(0, part);
        }
        while ((ustring.back() == '_' || ustring.back() == '-') &&
               (part < unit_string.size() - 1)) {
            hasSep = true;
            ustring.push_back(unit_string[part]);
            ++part;
        }
        if (isDigitCharacter(ustring.back())) {
            while ((part < unit_string.size() - 1) &&
                   (unit_string[part] == '.' ||
                    isDigitCharacter(unit_string[part]))) {
                ustring.push_back(unit_string[part]);
                ++part;
            }
        }
    }
    if (is_valid(possible)) {
        return possible;
    }
    if (minPartitionSize <= 1) {
        // meter is somewhat common ending so just check that one too
        if (unit_string.back() == 'm') {
            auto res = unit_quick_match(ustring, match_flags);
            if (is_valid(res)) {
                return res * m;
            }
        }
    }
    if (minPartitionSize <= 2 && !hasSep) {
        // now do a quick check with a 2 character string since we skipped that
        // earlier
        auto qm2 = unit_quick_match(unit_string.substr(0, 2), match_flags);
        if (is_valid(qm2)) {
            valid.insert(valid.begin(), unit_string.substr(0, 2));
        } else if (unit_string.size() == 4) {  // length of 4 is a bit odd so
                                               // check the back two characters
                                               // for a quick match
            qm2 = unit_quick_match(unit_string.substr(2, 2), match_flags);
            auto bunit = unit_from_string_internal(
                unit_string.substr(0, 2), match_flags);
            if (is_valid(bunit)) {
                return qm2 * bunit;
            }
        }
    }
    if (minPartitionSize <= 1) {
        // now pick off a couple 1 character units
        if (unit_string.front() == 'V' || unit_string.front() == 'A') {
            valid.insert(valid.begin(), unit_string.substr(0, 1));
        }
    }
    // start with the biggest
    std::reverse(valid.begin(), valid.end());
    for (auto& vd : valid) {
        auto res = unit_quick_match(vd, match_flags);
        auto nmatch_flags = (vd.size() > 3) ?
            match_flags :
            match_flags | minimum_partition_size3;
        auto bunit = unit_from_string_internal(
            unit_string.substr(vd.size()), nmatch_flags);
        if (is_valid(bunit)) {
            return res * bunit;
        }
    }

    return precise::invalid;
}